

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O2

size_t loader_impl_handle_name(plugin_manager manager,char *path,char *result)

{
  vector v;
  char *__string;
  int iVar1;
  void *pvVar2;
  size_t sVar3;
  undefined8 *puVar4;
  size_t sVar5;
  size_t sVar6;
  size_t position;
  
  pvVar2 = plugin_manager_impl(manager);
  v = *(vector *)((long)pvVar2 + 0x18);
  if (v == (vector)0x0) {
LAB_001225a7:
    sVar5 = strnlen(path,0x1000);
    memcpy(result,path,sVar5 + 1);
  }
  else {
    sVar3 = vector_size(v);
    position = 0;
    do {
      if (sVar3 == position) goto LAB_001225a7;
      puVar4 = (undefined8 *)vector_at(v,position);
      __string = (char *)*puVar4;
      sVar5 = strnlen(__string,0x1000);
      sVar6 = strnlen(path,0x1000);
      iVar1 = portability_path_is_subpath(__string,sVar5 + 1,path,sVar6 + 1);
      position = position + 1;
    } while (iVar1 == 0);
    sVar3 = portability_path_get_relative(__string,sVar5 + 1,path,sVar6 + 1,result,0x1000);
    sVar5 = sVar3 - 1;
  }
  return sVar5;
}

Assistant:

size_t loader_impl_handle_name(plugin_manager manager, const loader_path path, loader_path result)
{
	vector script_paths = plugin_manager_impl_type(manager, loader_manager_impl)->script_paths;

	if (script_paths != NULL)
	{
		size_t iterator, size = vector_size(script_paths);

		/* TODO: Should scripts_path be sorted in order to prevent name collisions? */
		for (iterator = 0; iterator < size; ++iterator)
		{
			char *script_path = vector_at_type(script_paths, iterator, char *);
			size_t script_path_size = strnlen(script_path, LOADER_PATH_SIZE) + 1;
			size_t path_size = strnlen(path, LOADER_PATH_SIZE) + 1;

			if (portability_path_is_subpath(script_path, script_path_size, path, path_size))
			{
				return portability_path_get_relative(script_path, script_path_size, path, path_size, result, LOADER_PATH_SIZE) - 1;
			}
		}
	}

	size_t length = strnlen(path, LOADER_PATH_SIZE);

	memcpy(result, path, length + 1);

	return length;
}